

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void google::protobuf::MessageFactory::InternalRegisterGeneratedMessage
               (Descriptor *descriptor,Message *prototype)

{
  bool bVar1;
  GeneratedMessageFactory *pGVar2;
  LogMessage *pLVar3;
  LogFinisher local_59;
  Descriptor *local_58;
  Message *local_50;
  LogMessage local_48;
  
  pGVar2 = anon_unknown_0::GeneratedMessageFactory::singleton();
  local_58 = descriptor;
  local_50 = prototype;
  bVar1 = InsertIfNotPresent<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                    (&pGVar2->type_map_,&local_58,&local_50);
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x256);
    pLVar3 = internal::LogMessage::operator<<(&local_48,"Type is already registered: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,*(string **)(local_58 + 8));
    internal::LogFinisher::operator=(&local_59,pLVar3);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedMessage(
    const Descriptor* descriptor, const Message* prototype) {
  GeneratedMessageFactory::singleton()->RegisterType(descriptor, prototype);
}